

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uchar * substring(uchar *s,uint start,uint end,uint *new_size)

{
  uchar *puVar1;
  uint local_34;
  uint i;
  uchar *ret;
  uint len;
  uint *new_size_local;
  uint end_local;
  uint start_local;
  uchar *s_local;
  
  if (end == start) {
    fatal((uchar *)"substring",(uchar *)"end-start <= 0\n");
  }
  if (new_size != (uint *)0x0) {
    *new_size = (end - start) + 1;
  }
  puVar1 = (uchar *)calloc((ulong)((end - start) + 2),1);
  for (local_34 = start; local_34 <= end; local_34 = local_34 + 1) {
    puVar1[local_34 - start] = s[local_34];
  }
  return puVar1;
}

Assistant:

uint8_t *substring(uint8_t *s, uint32_t start, uint32_t end, uint32_t *new_size)
{
    if (end - start <= 0)
        fatal("substring", "end-start <= 0\n");

    // size of substr + \0
    uint32_t len = end - start + 1;
    if (new_size != NULL)
        *new_size = len;

    uint8_t *ret = (uint8_t *)calloc(len + 1, sizeof(uint8_t));
    for (uint32_t i = start; i <= end; i++)
        ret[i - start] = s[i];
    return ret;
}